

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int Ifn_AddClause(sat_solver *pSat,int *pBeg,int *pEnd)

{
  int iVar1;
  int RetValue;
  int fVerbose;
  int *pEnd_local;
  int *pBeg_local;
  sat_solver *pSat_local;
  
  iVar1 = sat_solver_addclause(pSat,pBeg,pEnd);
  return iVar1;
}

Assistant:

int Ifn_AddClause( sat_solver * pSat, int * pBeg, int * pEnd )
{
    int fVerbose = 0;
    int RetValue = sat_solver_addclause( pSat, pBeg, pEnd );
    if ( fVerbose )
    {
        for ( ; pBeg < pEnd; pBeg++ )
            printf( "%c%d ", Abc_LitIsCompl(*pBeg) ? '-':'+', Abc_Lit2Var(*pBeg) );
        printf( "\n" );
    }
    return RetValue;
}